

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O1

int main(void)

{
  PaError PVar1;
  PaDeviceInfo *pPVar2;
  PaStream *stream;
  PaStreamParameters inputParameters;
  PaStreamParameters outputParameters;
  PaStream *local_50;
  PaStreamParameters local_48;
  PaStreamParameters local_28;
  
  PVar1 = Pa_Initialize();
  if (PVar1 == 0) {
    local_48.device = Pa_GetDefaultInputDevice();
    if (local_48.device == -1) {
      main_cold_2();
    }
    else {
      local_48.channelCount = 2;
      local_48.sampleFormat = 1;
      pPVar2 = Pa_GetDeviceInfo(local_48.device);
      local_48.suggestedLatency = pPVar2->defaultLowInputLatency;
      local_48.hostApiSpecificStreamInfo = (void *)0x0;
      local_28.device = Pa_GetDefaultOutputDevice();
      if (local_28.device == -1) {
        main_cold_1();
      }
      else {
        local_28.channelCount = 2;
        local_28.sampleFormat = 1;
        pPVar2 = Pa_GetDeviceInfo(local_28.device);
        local_28.suggestedLatency = pPVar2->defaultLowOutputLatency;
        local_28.hostApiSpecificStreamInfo = (void *)0x0;
        PVar1 = Pa_OpenStream(&local_50,&local_48,&local_28,44100.0,0x40,0,fuzzCallback,(void *)0x0)
        ;
        if ((PVar1 == 0) && (PVar1 = Pa_StartStream(local_50), PVar1 == 0)) {
          puts("Hit ENTER to stop program.");
          getchar();
          PVar1 = Pa_CloseStream(local_50);
          if (PVar1 == 0) {
            printf("Finished. gNumNoInputs = %d\n",(ulong)(uint)gNumNoInputs);
            Pa_Terminate();
            return 0;
          }
        }
      }
    }
  }
  main_cold_3();
  return -1;
}

Assistant:

int main(void)
{
    PaStreamParameters inputParameters, outputParameters;
    PaStream *stream;
    PaError err;

    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default input device.\n");
      goto error;
    }
    inputParameters.channelCount = 2;       /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              0, /* paClipOff, */  /* we won't output out of range samples so don't bother clipping them */
              fuzzCallback,
              NULL );
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Hit ENTER to stop program.\n");
    getchar();
    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    printf("Finished. gNumNoInputs = %d\n", gNumNoInputs );
    Pa_Terminate();
    return 0;

error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return -1;
}